

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ans_reorder_fold.hpp
# Opt level: O3

ans_reorder_fold_encode<1U> *
ans_reorder_fold_encode<1U>::create
          (ans_reorder_fold_encode<1U> *__return_storage_ptr__,uint32_t *in_u32,size_t n)

{
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this;
  pointer puVar1;
  iterator __position;
  pointer puVar2;
  bool bVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined8 uVar6;
  byte bVar7;
  byte bVar8;
  pointer ppVar9;
  pointer puVar10;
  pointer ppVar11;
  pointer __s;
  ulong uVar12;
  size_t sVar13;
  long lVar14;
  uint64_t uVar15;
  uint *puVar16;
  uint64_t *puVar17;
  long lVar18;
  uint uVar19;
  uint32_t uVar21;
  uint uVar22;
  undefined8 unaff_R12;
  int iVar23;
  int iVar24;
  ulong __n;
  ushort uVar25;
  undefined1 auVar26 [32];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  vector<std::pair<long,_unsigned_int>,_std::allocator<std::pair<long,_unsigned_int>_>_>
  unmapped_freqs;
  vector<std::pair<long,_unsigned_int>,_std::allocator<std::pair<long,_unsigned_int>_>_> local_90;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_78;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_70;
  undefined1 local_58 [16];
  pointer local_48;
  ulong local_38;
  uint uVar20;
  
  auVar34 = ZEXT1664((undefined1  [16])0x0);
  auVar27 = vmovdqu64_avx512f(auVar34);
  *(undefined1 (*) [64])
   &(__return_storage_ptr__->table).
    super__Vector_base<enc_entry_reorder_fold,_std::allocator<enc_entry_reorder_fold>_>._M_impl.
    super__Vector_impl_data._M_finish = auVar27;
  auVar27 = vmovdqu64_avx512f(auVar34);
  __return_storage_ptr__->nfreqs =
       (vector<unsigned_int,_std::allocator<unsigned_int>_>)auVar27._0_24_;
  __return_storage_ptr__->table =
       (vector<enc_entry_reorder_fold,_std::allocator<enc_entry_reorder_fold>_>)auVar27._24_24_;
  (__return_storage_ptr__->mapping).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)auVar27._48_8_;
  (__return_storage_ptr__->mapping).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)auVar27._56_8_;
  if (n == 0) {
    uVar12 = 0;
  }
  else {
    auVar27 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar28 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar29 = vpbroadcastq_avx512f();
    uVar12 = 0;
    do {
      auVar30 = vpbroadcastq_avx512f();
      auVar31 = vmovdqa64_avx512f(auVar34);
      auVar34 = vporq_avx512f(auVar30,auVar27);
      auVar30 = vporq_avx512f(auVar30,auVar28);
      uVar6 = vpcmpuq_avx512f(auVar30,auVar29,2);
      bVar7 = (byte)uVar6;
      uVar6 = vpcmpuq_avx512f(auVar34,auVar29,2);
      bVar8 = (byte)uVar6;
      uVar25 = CONCAT11(bVar8,bVar7);
      auVar34 = vmovdqu32_avx512f(*(undefined1 (*) [64])(in_u32 + uVar12));
      auVar30._4_4_ = (uint)((byte)(uVar25 >> 1) & 1) * auVar34._4_4_;
      auVar30._0_4_ = (uint)(bVar7 & 1) * auVar34._0_4_;
      auVar30._8_4_ = (uint)((byte)(uVar25 >> 2) & 1) * auVar34._8_4_;
      auVar30._12_4_ = (uint)((byte)(uVar25 >> 3) & 1) * auVar34._12_4_;
      auVar30._16_4_ = (uint)((byte)(uVar25 >> 4) & 1) * auVar34._16_4_;
      auVar30._20_4_ = (uint)((byte)(uVar25 >> 5) & 1) * auVar34._20_4_;
      auVar30._24_4_ = (uint)((byte)(uVar25 >> 6) & 1) * auVar34._24_4_;
      auVar30._28_4_ = (uint)((byte)(uVar25 >> 7) & 1) * auVar34._28_4_;
      auVar30._32_4_ = (uint)(bVar8 & 1) * auVar34._32_4_;
      auVar30._36_4_ = (uint)(bVar8 >> 1 & 1) * auVar34._36_4_;
      auVar30._40_4_ = (uint)(bVar8 >> 2 & 1) * auVar34._40_4_;
      auVar30._44_4_ = (uint)(bVar8 >> 3 & 1) * auVar34._44_4_;
      auVar30._48_4_ = (uint)(bVar8 >> 4 & 1) * auVar34._48_4_;
      auVar30._52_4_ = (uint)(bVar8 >> 5 & 1) * auVar34._52_4_;
      auVar30._56_4_ = (uint)(bVar8 >> 6 & 1) * auVar34._56_4_;
      auVar30._60_4_ = (uint)(bVar8 >> 7) * auVar34._60_4_;
      uVar12 = uVar12 + 0x10;
      auVar34 = vpmaxud_avx512f(auVar30,auVar31);
    } while ((n + 0xf & 0xfffffffffffffff0) != uVar12);
    auVar34 = vmovdqa32_avx512f(auVar34);
    auVar27._0_4_ = (uint)(bVar7 & 1) * auVar34._0_4_ | (uint)!(bool)(bVar7 & 1) * auVar31._0_4_;
    bVar3 = (bool)((byte)(uVar25 >> 1) & 1);
    auVar27._4_4_ = (uint)bVar3 * auVar34._4_4_ | (uint)!bVar3 * auVar31._4_4_;
    bVar3 = (bool)((byte)(uVar25 >> 2) & 1);
    auVar27._8_4_ = (uint)bVar3 * auVar34._8_4_ | (uint)!bVar3 * auVar31._8_4_;
    bVar3 = (bool)((byte)(uVar25 >> 3) & 1);
    auVar27._12_4_ = (uint)bVar3 * auVar34._12_4_ | (uint)!bVar3 * auVar31._12_4_;
    bVar3 = (bool)((byte)(uVar25 >> 4) & 1);
    auVar27._16_4_ = (uint)bVar3 * auVar34._16_4_ | (uint)!bVar3 * auVar31._16_4_;
    bVar3 = (bool)((byte)(uVar25 >> 5) & 1);
    auVar27._20_4_ = (uint)bVar3 * auVar34._20_4_ | (uint)!bVar3 * auVar31._20_4_;
    bVar3 = (bool)((byte)(uVar25 >> 6) & 1);
    auVar27._24_4_ = (uint)bVar3 * auVar34._24_4_ | (uint)!bVar3 * auVar31._24_4_;
    bVar3 = (bool)((byte)(uVar25 >> 7) & 1);
    auVar27._28_4_ = (uint)bVar3 * auVar34._28_4_ | (uint)!bVar3 * auVar31._28_4_;
    auVar27._32_4_ = (uint)(bVar8 & 1) * auVar34._32_4_ | (uint)!(bool)(bVar8 & 1) * auVar31._32_4_;
    bVar3 = (bool)(bVar8 >> 1 & 1);
    auVar27._36_4_ = (uint)bVar3 * auVar34._36_4_ | (uint)!bVar3 * auVar31._36_4_;
    bVar3 = (bool)(bVar8 >> 2 & 1);
    auVar27._40_4_ = (uint)bVar3 * auVar34._40_4_ | (uint)!bVar3 * auVar31._40_4_;
    bVar3 = (bool)(bVar8 >> 3 & 1);
    auVar27._44_4_ = (uint)bVar3 * auVar34._44_4_ | (uint)!bVar3 * auVar31._44_4_;
    bVar3 = (bool)(bVar8 >> 4 & 1);
    auVar27._48_4_ = (uint)bVar3 * auVar34._48_4_ | (uint)!bVar3 * auVar31._48_4_;
    bVar3 = (bool)(bVar8 >> 5 & 1);
    auVar27._52_4_ = (uint)bVar3 * auVar34._52_4_ | (uint)!bVar3 * auVar31._52_4_;
    bVar3 = (bool)(bVar8 >> 6 & 1);
    auVar27._56_4_ = (uint)bVar3 * auVar34._56_4_ | (uint)!bVar3 * auVar31._56_4_;
    auVar27._60_4_ =
         (uint)(bVar8 >> 7) * auVar34._60_4_ | (uint)!(bool)(bVar8 >> 7) * auVar31._60_4_;
    auVar26 = vextracti64x4_avx512f(auVar27,1);
    auVar27 = vpmaxud_avx512f(auVar27,ZEXT3264(auVar26));
    auVar4 = vpmaxud_avx(auVar27._0_16_,auVar27._16_16_);
    auVar5 = vpshufd_avx(auVar4,0xee);
    auVar4 = vpmaxud_avx(auVar4,auVar5);
    auVar5 = vpshufd_avx(auVar4,0x55);
    auVar4 = vpmaxud_avx(auVar4,auVar5);
    uVar12 = CONCAT44((int)((ulong)unaff_R12 >> 0x20),auVar4._0_4_);
  }
  __n = (ulong)((int)uVar12 + 1);
  std::vector<std::pair<long,_unsigned_int>,_std::allocator<std::pair<long,_unsigned_int>_>_>::
  vector(&local_90,__n,(allocator_type *)&local_70);
  ppVar9 = local_90.
           super__Vector_base<std::pair<long,_unsigned_int>,_std::allocator<std::pair<long,_unsigned_int>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  ppVar11 = local_90.
            super__Vector_base<std::pair<long,_unsigned_int>,_std::allocator<std::pair<long,_unsigned_int>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (n != 0) {
    sVar13 = 0;
    do {
      uVar22 = in_u32[sVar13];
      sVar13 = sVar13 + 1;
      local_90.
      super__Vector_base<std::pair<long,_unsigned_int>,_std::allocator<std::pair<long,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start[uVar22].first =
           local_90.
           super__Vector_base<std::pair<long,_unsigned_int>,_std::allocator<std::pair<long,_unsigned_int>_>_>
           ._M_impl.super__Vector_impl_data._M_start[uVar22].first + -1;
      local_90.
      super__Vector_base<std::pair<long,_unsigned_int>,_std::allocator<std::pair<long,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start[uVar22].second = uVar22;
    } while (n != sVar13);
  }
  local_38 = uVar12;
  if (local_90.
      super__Vector_base<std::pair<long,_unsigned_int>,_std::allocator<std::pair<long,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      local_90.
      super__Vector_base<std::pair<long,_unsigned_int>,_std::allocator<std::pair<long,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    __return_storage_ptr__->sigma = 0;
  }
  else {
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<long,unsigned_int>*,std::vector<std::pair<long,unsigned_int>,std::allocator<std::pair<long,unsigned_int>>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_90.
               super__Vector_base<std::pair<long,_unsigned_int>,_std::allocator<std::pair<long,_unsigned_int>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               local_90.
               super__Vector_base<std::pair<long,_unsigned_int>,_std::allocator<std::pair<long,_unsigned_int>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,
               (int)LZCOUNT((long)local_90.
                                  super__Vector_base<std::pair<long,_unsigned_int>,_std::allocator<std::pair<long,_unsigned_int>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)local_90.
                                  super__Vector_base<std::pair<long,_unsigned_int>,_std::allocator<std::pair<long,_unsigned_int>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 4) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<std::pair<long,unsigned_int>*,std::vector<std::pair<long,unsigned_int>,std::allocator<std::pair<long,unsigned_int>>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (ppVar11,ppVar9);
    __return_storage_ptr__->sigma = 0;
    if ((long)local_90.
              super__Vector_base<std::pair<long,_unsigned_int>,_std::allocator<std::pair<long,_unsigned_int>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)local_90.
              super__Vector_base<std::pair<long,_unsigned_int>,_std::allocator<std::pair<long,_unsigned_int>_>_>
              ._M_impl.super__Vector_impl_data._M_start != 0) {
      lVar14 = (long)local_90.
                     super__Vector_base<std::pair<long,_unsigned_int>,_std::allocator<std::pair<long,_unsigned_int>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_90.
                     super__Vector_base<std::pair<long,_unsigned_int>,_std::allocator<std::pair<long,_unsigned_int>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 4;
      uVar15 = 1;
      ppVar11 = local_90.
                super__Vector_base<std::pair<long,_unsigned_int>,_std::allocator<std::pair<long,_unsigned_int>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      do {
        if (ppVar11->first == 0) break;
        lVar18 = (-(ulong)(lVar14 == 0) - lVar14) + 1 + uVar15;
        __return_storage_ptr__->sigma = uVar15;
        uVar15 = uVar15 + 1;
        ppVar11 = ppVar11 + 1;
      } while (lVar18 != 1);
    }
  }
  this = &__return_storage_ptr__->mapping;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(this,__n);
  local_78 = this;
  if (__return_storage_ptr__->sigma < 0x100) {
    if (__n != 0) {
      auVar27 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar34 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      auVar28 = vpmovsxbd_avx512f(_DAT_0018b300);
      auVar29 = vpbroadcastq_avx512f(ZEXT816(0x10));
      auVar30 = vpbroadcastd_avx512f(ZEXT416(0x10));
      lVar14 = 0;
      auVar31 = vpbroadcastq_avx512f();
      puVar1 = (this->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      do {
        vpcmpuq_avx512f(auVar34,auVar31,2);
        vpcmpuq_avx512f(auVar27,auVar31,2);
        auVar34 = vpaddq_avx512f(auVar34,auVar29);
        auVar27 = vpaddq_avx512f(auVar27,auVar29);
        auVar32 = vmovdqu32_avx512f(auVar28);
        *(undefined1 (*) [64])((long)puVar1 + lVar14) = auVar32;
        auVar28 = vpaddd_avx512f(auVar28,auVar30);
        lVar14 = lVar14 + 0x40;
      } while ((__n + 0xf >> 4) * 0x40 != lVar14);
    }
  }
  else {
    auVar27 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar34 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar28 = vpmovsxbd_avx512f(_DAT_0018b300);
    auVar29 = vpbroadcastd_avx512f(ZEXT416(0x100));
    auVar30 = vpbroadcastq_avx512f(ZEXT816(0x10));
    auVar31 = vpbroadcastd_avx512f(ZEXT416(0x10));
    puVar1 = (this->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    lVar14 = 0;
    auVar32 = vpbroadcastq_avx512f();
    do {
      vpcmpuq_avx512f(auVar34,auVar32,2);
      vpcmpuq_avx512f(auVar27,auVar32,2);
      auVar33 = vpaddd_avx512f(auVar28,auVar29);
      auVar34 = vpaddq_avx512f(auVar34,auVar30);
      auVar27 = vpaddq_avx512f(auVar27,auVar30);
      auVar28 = vpaddd_avx512f(auVar28,auVar31);
      auVar33 = vmovdqu32_avx512f(auVar33);
      *(undefined1 (*) [64])((long)puVar1 + lVar14) = auVar33;
      lVar14 = lVar14 + 0x40;
    } while (((local_38 & 0xffffffff) + 0x10 >> 4) * 0x40 != lVar14);
    lVar14 = 8;
    uVar22 = 0;
    do {
      puVar16 = (uint *)((long)&(local_90.
                                 super__Vector_base<std::pair<long,_unsigned_int>,_std::allocator<std::pair<long,_unsigned_int>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->first + lVar14);
      (__return_storage_ptr__->mapping).
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start
      [*(uint *)((long)&(local_90.
                         super__Vector_base<std::pair<long,_unsigned_int>,_std::allocator<std::pair<long,_unsigned_int>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->first + lVar14)] = uVar22;
      __position._M_current =
           (__return_storage_ptr__->most_frequent).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (__return_storage_ptr__->most_frequent).
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,std::allocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>
                  ((vector<unsigned_int,std::allocator<unsigned_int>> *)
                   &__return_storage_ptr__->most_frequent,__position,puVar16);
      }
      else {
        *__position._M_current = *puVar16;
        (__return_storage_ptr__->most_frequent).
        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      lVar14 = lVar14 + 0x10;
      uVar22 = uVar22 + 1;
    } while (lVar14 != 0x1008);
  }
  __s = (pointer)operator_new(0x2000);
  uVar22 = 0;
  local_70.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = __s;
  local_70.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = __s + 0x400;
  memset(__s,0,0x2000);
  if (n != 0) {
    sVar13 = 0;
    uVar22 = 0;
    puVar1 = (local_78->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    do {
      iVar23 = 0;
      uVar20 = puVar1[in_u32[sVar13]];
      uVar19 = uVar20;
      iVar24 = 0;
      if (0xff < uVar20) {
        do {
          uVar19 = uVar20 >> 8;
          iVar23 = iVar23 + 0xff;
          bVar3 = 0xffff < uVar20;
          uVar20 = uVar19;
          iVar24 = iVar23;
        } while (bVar3);
      }
      uVar19 = iVar24 + uVar19;
      __s[uVar19] = __s[uVar19] + 1;
      if (uVar19 <= uVar22) {
        uVar19 = uVar22;
      }
      uVar22 = uVar19;
      sVar13 = sVar13 + 1;
    } while (sVar13 != n);
  }
  local_70.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = __s + 0x400;
  adjust_freqs((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_58,&local_70,uVar22,true
               ,1);
  puVar10 = local_48;
  puVar1 = (__return_storage_ptr__->nfreqs).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar2 = (__return_storage_ptr__->nfreqs).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  local_48 = (pointer)0x0;
  (__return_storage_ptr__->nfreqs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)local_58._0_8_;
  (__return_storage_ptr__->nfreqs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)local_58._8_8_;
  (__return_storage_ptr__->nfreqs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = puVar10;
  local_58 = (undefined1  [16])0x0;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1,(long)puVar2 - (long)puVar1);
    if ((pointer)local_58._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_58._0_8_,(long)local_48 - local_58._0_8_);
    }
  }
  puVar1 = (__return_storage_ptr__->nfreqs).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar2 = (__return_storage_ptr__->nfreqs).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (puVar1 == puVar2) {
    uVar15 = 0;
  }
  else {
    auVar27 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar34 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar29 = ZEXT1664((undefined1  [16])0x0);
    uVar12 = 0;
    auVar28 = vpbroadcastq_avx512f();
    auVar28 = vpsrlq_avx512f(auVar28,2);
    do {
      auVar30 = vpbroadcastq_avx512f();
      auVar31 = vmovdqa64_avx512f(auVar29);
      auVar29 = vporq_avx512f(auVar30,auVar27);
      auVar30 = vporq_avx512f(auVar30,auVar34);
      uVar6 = vpcmpuq_avx512f(auVar30,auVar28,2);
      bVar7 = (byte)uVar6;
      uVar6 = vpcmpuq_avx512f(auVar29,auVar28,2);
      bVar8 = (byte)uVar6;
      uVar25 = CONCAT11(bVar8,bVar7);
      auVar29 = vmovdqu32_avx512f(*(undefined1 (*) [64])(puVar1 + uVar12));
      auVar32._4_4_ = (uint)((byte)(uVar25 >> 1) & 1) * auVar29._4_4_;
      auVar32._0_4_ = (uint)(bVar7 & 1) * auVar29._0_4_;
      auVar32._8_4_ = (uint)((byte)(uVar25 >> 2) & 1) * auVar29._8_4_;
      auVar32._12_4_ = (uint)((byte)(uVar25 >> 3) & 1) * auVar29._12_4_;
      auVar32._16_4_ = (uint)((byte)(uVar25 >> 4) & 1) * auVar29._16_4_;
      auVar32._20_4_ = (uint)((byte)(uVar25 >> 5) & 1) * auVar29._20_4_;
      auVar32._24_4_ = (uint)((byte)(uVar25 >> 6) & 1) * auVar29._24_4_;
      auVar32._28_4_ = (uint)((byte)(uVar25 >> 7) & 1) * auVar29._28_4_;
      auVar32._32_4_ = (uint)(bVar8 & 1) * auVar29._32_4_;
      auVar32._36_4_ = (uint)(bVar8 >> 1 & 1) * auVar29._36_4_;
      auVar32._40_4_ = (uint)(bVar8 >> 2 & 1) * auVar29._40_4_;
      auVar32._44_4_ = (uint)(bVar8 >> 3 & 1) * auVar29._44_4_;
      auVar32._48_4_ = (uint)(bVar8 >> 4 & 1) * auVar29._48_4_;
      auVar32._52_4_ = (uint)(bVar8 >> 5 & 1) * auVar29._52_4_;
      auVar32._56_4_ = (uint)(bVar8 >> 6 & 1) * auVar29._56_4_;
      auVar32._60_4_ = (uint)(bVar8 >> 7) * auVar29._60_4_;
      uVar12 = uVar12 + 0x10;
      auVar29 = vpaddd_avx512f(auVar32,auVar31);
    } while ((((ulong)((long)puVar2 + (-4 - (long)puVar1)) >> 2) + 0x10 & 0xfffffffffffffff0) !=
             uVar12);
    auVar27 = vmovdqa32_avx512f(auVar29);
    auVar34._0_4_ = (uint)(bVar7 & 1) * auVar27._0_4_ | (uint)!(bool)(bVar7 & 1) * auVar31._0_4_;
    bVar3 = (bool)((byte)(uVar25 >> 1) & 1);
    auVar34._4_4_ = (uint)bVar3 * auVar27._4_4_ | (uint)!bVar3 * auVar31._4_4_;
    bVar3 = (bool)((byte)(uVar25 >> 2) & 1);
    auVar34._8_4_ = (uint)bVar3 * auVar27._8_4_ | (uint)!bVar3 * auVar31._8_4_;
    bVar3 = (bool)((byte)(uVar25 >> 3) & 1);
    auVar34._12_4_ = (uint)bVar3 * auVar27._12_4_ | (uint)!bVar3 * auVar31._12_4_;
    bVar3 = (bool)((byte)(uVar25 >> 4) & 1);
    auVar34._16_4_ = (uint)bVar3 * auVar27._16_4_ | (uint)!bVar3 * auVar31._16_4_;
    bVar3 = (bool)((byte)(uVar25 >> 5) & 1);
    auVar34._20_4_ = (uint)bVar3 * auVar27._20_4_ | (uint)!bVar3 * auVar31._20_4_;
    bVar3 = (bool)((byte)(uVar25 >> 6) & 1);
    auVar34._24_4_ = (uint)bVar3 * auVar27._24_4_ | (uint)!bVar3 * auVar31._24_4_;
    bVar3 = (bool)((byte)(uVar25 >> 7) & 1);
    auVar34._28_4_ = (uint)bVar3 * auVar27._28_4_ | (uint)!bVar3 * auVar31._28_4_;
    auVar34._32_4_ = (uint)(bVar8 & 1) * auVar27._32_4_ | (uint)!(bool)(bVar8 & 1) * auVar31._32_4_;
    bVar3 = (bool)(bVar8 >> 1 & 1);
    auVar34._36_4_ = (uint)bVar3 * auVar27._36_4_ | (uint)!bVar3 * auVar31._36_4_;
    bVar3 = (bool)(bVar8 >> 2 & 1);
    auVar34._40_4_ = (uint)bVar3 * auVar27._40_4_ | (uint)!bVar3 * auVar31._40_4_;
    bVar3 = (bool)(bVar8 >> 3 & 1);
    auVar34._44_4_ = (uint)bVar3 * auVar27._44_4_ | (uint)!bVar3 * auVar31._44_4_;
    bVar3 = (bool)(bVar8 >> 4 & 1);
    auVar34._48_4_ = (uint)bVar3 * auVar27._48_4_ | (uint)!bVar3 * auVar31._48_4_;
    bVar3 = (bool)(bVar8 >> 5 & 1);
    auVar34._52_4_ = (uint)bVar3 * auVar27._52_4_ | (uint)!bVar3 * auVar31._52_4_;
    bVar3 = (bool)(bVar8 >> 6 & 1);
    auVar34._56_4_ = (uint)bVar3 * auVar27._56_4_ | (uint)!bVar3 * auVar31._56_4_;
    auVar34._60_4_ =
         (uint)(bVar8 >> 7) * auVar27._60_4_ | (uint)!(bool)(bVar8 >> 7) * auVar31._60_4_;
    auVar26 = vextracti64x4_avx512f(auVar34,1);
    auVar27 = vpaddd_avx512f(auVar34,ZEXT3264(auVar26));
    auVar4 = vpaddd_avx(auVar27._0_16_,auVar27._16_16_);
    auVar5 = vpshufd_avx(auVar4,0xee);
    auVar4 = vpaddd_avx(auVar4,auVar5);
    auVar5 = vpshufd_avx(auVar4,0x55);
    auVar4 = vpaddd_avx(auVar4,auVar5);
    uVar15 = (uint64_t)auVar4._0_4_;
  }
  __return_storage_ptr__->frame_size = uVar15;
  std::vector<enc_entry_reorder_fold,_std::allocator<enc_entry_reorder_fold>_>::resize
            (&__return_storage_ptr__->table,(ulong)(uVar22 + 1));
  puVar1 = (__return_storage_ptr__->nfreqs).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar14 = (long)(__return_storage_ptr__->nfreqs).
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish - (long)puVar1;
  if (lVar14 != 0) {
    lVar14 = lVar14 >> 2;
    lVar18 = 0;
    uVar21 = 0;
    puVar17 = &((__return_storage_ptr__->table).
                super__Vector_base<enc_entry_reorder_fold,_std::allocator<enc_entry_reorder_fold>_>.
                _M_impl.super__Vector_impl_data._M_start)->sym_upper_bound;
    do {
      ((enc_entry_reorder_fold *)(puVar17 + -1))->freq = (uint16_t)puVar1[lVar18];
      *(uint32_t *)((long)puVar17 + -4) = uVar21;
      puVar16 = puVar1 + lVar18;
      lVar18 = lVar18 + 1;
      uVar21 = uVar21 + *puVar16;
      *puVar17 = (ulong)*puVar16 << 0x24;
      puVar17 = puVar17 + 2;
    } while (lVar14 + (ulong)(lVar14 == 0) != lVar18);
  }
  __return_storage_ptr__->lower_bound = __return_storage_ptr__->frame_size << 4;
  if (local_70.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_70.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_70.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_70.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_90.
      super__Vector_base<std::pair<long,_unsigned_int>,_std::allocator<std::pair<long,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_90.
                    super__Vector_base<std::pair<long,_unsigned_int>,_std::allocator<std::pair<long,_unsigned_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_90.
                          super__Vector_base<std::pair<long,_unsigned_int>,_std::allocator<std::pair<long,_unsigned_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_90.
                          super__Vector_base<std::pair<long,_unsigned_int>,_std::allocator<std::pair<long,_unsigned_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

static ans_reorder_fold_encode create(const uint32_t* in_u32, size_t n)
    {
        ans_reorder_fold_encode model;

        // 1) identify most frequent syms
        uint32_t unmapped_max_sym = 0;
        for (size_t i = 0; i < n; i++) {
            unmapped_max_sym = std::max(in_u32[i], unmapped_max_sym);
        }
        std::vector<std::pair<int64_t, uint32_t>> unmapped_freqs(
            unmapped_max_sym + 1);
        for (size_t i = 0; i < n; i++) {
            unmapped_freqs[in_u32[i]].first--;
            unmapped_freqs[in_u32[i]].second = in_u32[i];
        }
        std::sort(unmapped_freqs.begin(), unmapped_freqs.end());
        model.sigma = 0;
        for (size_t i = 0; i < unmapped_freqs.size(); i++) {
            if (unmapped_freqs[i].first == 0)
                break;
            model.sigma++;
        }
        size_t no_except_thres = 1 << (fidelity + 8 - 1);
        model.mapping.resize(unmapped_max_sym + 1);
        if (model.sigma < no_except_thres) {
            for (size_t i = 0; i < unmapped_max_sym + 1; i++) {
                model.mapping[i] = i;
            }
        } else {
            for (size_t i = 0; i <= unmapped_max_sym; i++) {
                model.mapping[i] = i + no_except_thres;
            }
            for (size_t i = 0; i < no_except_thres; i++) {
                model.mapping[unmapped_freqs[i].second] = i;
                model.most_frequent.push_back(unmapped_freqs[i].second);
            }
        }
        const uint32_t MAX_SIGMA = 1 << (fidelity + 8 + 1);
        std::vector<uint64_t> freqs(MAX_SIGMA, 0);
        uint32_t max_sym = 0;
        for (size_t i = 0; i < n; i++) {
            auto mapped_u32
                = ans_reorder_fold_mapping<fidelity>(model.mapping[in_u32[i]]);
            freqs[mapped_u32]++;
            max_sym = std::max(mapped_u32, max_sym);
        }
        model.nfreqs = adjust_freqs(freqs, max_sym, true);
        model.frame_size = std::accumulate(
            std::begin(model.nfreqs), std::end(model.nfreqs), 0);
        uint64_t cur_base = 0;
        uint64_t tmp = constants::K * constants::RADIX;
        model.table.resize(max_sym + 1);
        for (size_t sym = 0; sym < model.nfreqs.size(); sym++) {
            model.table[sym].freq = model.nfreqs[sym];
            model.table[sym].base = cur_base;
            model.table[sym].sym_upper_bound = tmp * model.nfreqs[sym];
            cur_base += model.nfreqs[sym];
        }
        model.lower_bound = constants::K * model.frame_size;
        return model;
    }